

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignatureRefining::run(wasm
::Module*)::Info,(wasm::Mutability)1,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::
Info&)>)::Mapper::doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  *this_00;
  _Base_ptr p_Var2;
  _Link_type_conflict1 __z;
  const_iterator __x;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  const_iterator __position;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  Function *local_38;
  
  this_00 = *(_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              **)((long)this + 0x138);
  p_Var2 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    p_Var4 = p_Var2;
    do {
      if (*(Function **)(p_Var4 + 1) >= curr) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < curr];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (__position._M_node = &p_Var1->_M_header, *(Function **)(p_Var3 + 1) <= curr)) {
      do {
        if (*(Function **)(p_Var2 + 1) >= curr) {
          __position._M_node = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < curr];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
         (__x._M_node = __position._M_node, curr < *(Function **)(__position._M_node + 1))) {
        __z = (_Link_type_conflict1)operator_new(0x80);
        *(Function **)(__z->_M_storage)._M_storage = curr;
        (__z->_M_storage)._M_storage[0x48] = '\0';
        (__z->_M_storage)._M_storage[0x49] = '\0';
        (__z->_M_storage)._M_storage[0x4a] = '\0';
        (__z->_M_storage)._M_storage[0x4b] = '\0';
        (__z->_M_storage)._M_storage[0x4c] = '\0';
        (__z->_M_storage)._M_storage[0x4d] = '\0';
        (__z->_M_storage)._M_storage[0x4e] = '\0';
        (__z->_M_storage)._M_storage[0x4f] = '\0';
        (__z->_M_storage)._M_storage[0x50] = '\0';
        (__z->_M_storage)._M_storage[0x51] = '\0';
        (__z->_M_storage)._M_storage[0x52] = '\0';
        (__z->_M_storage)._M_storage[0x53] = '\0';
        (__z->_M_storage)._M_storage[0x54] = '\0';
        (__z->_M_storage)._M_storage[0x55] = '\0';
        (__z->_M_storage)._M_storage[0x56] = '\0';
        (__z->_M_storage)._M_storage[0x57] = '\0';
        (__z->_M_storage)._M_storage[8] = '\0';
        (__z->_M_storage)._M_storage[9] = '\0';
        (__z->_M_storage)._M_storage[10] = '\0';
        (__z->_M_storage)._M_storage[0xb] = '\0';
        (__z->_M_storage)._M_storage[0xc] = '\0';
        (__z->_M_storage)._M_storage[0xd] = '\0';
        (__z->_M_storage)._M_storage[0xe] = '\0';
        (__z->_M_storage)._M_storage[0xf] = '\0';
        (__z->_M_storage)._M_storage[0x10] = '\0';
        (__z->_M_storage)._M_storage[0x11] = '\0';
        (__z->_M_storage)._M_storage[0x12] = '\0';
        (__z->_M_storage)._M_storage[0x13] = '\0';
        (__z->_M_storage)._M_storage[0x14] = '\0';
        (__z->_M_storage)._M_storage[0x15] = '\0';
        (__z->_M_storage)._M_storage[0x16] = '\0';
        (__z->_M_storage)._M_storage[0x17] = '\0';
        (__z->_M_storage)._M_storage[0x18] = '\0';
        (__z->_M_storage)._M_storage[0x19] = '\0';
        (__z->_M_storage)._M_storage[0x1a] = '\0';
        (__z->_M_storage)._M_storage[0x1b] = '\0';
        (__z->_M_storage)._M_storage[0x1c] = '\0';
        (__z->_M_storage)._M_storage[0x1d] = '\0';
        (__z->_M_storage)._M_storage[0x1e] = '\0';
        (__z->_M_storage)._M_storage[0x1f] = '\0';
        (__z->_M_storage)._M_storage[0x20] = '\0';
        (__z->_M_storage)._M_storage[0x21] = '\0';
        (__z->_M_storage)._M_storage[0x22] = '\0';
        (__z->_M_storage)._M_storage[0x23] = '\0';
        (__z->_M_storage)._M_storage[0x24] = '\0';
        (__z->_M_storage)._M_storage[0x25] = '\0';
        (__z->_M_storage)._M_storage[0x26] = '\0';
        (__z->_M_storage)._M_storage[0x27] = '\0';
        (__z->_M_storage)._M_storage[0x28] = '\0';
        (__z->_M_storage)._M_storage[0x29] = '\0';
        (__z->_M_storage)._M_storage[0x2a] = '\0';
        (__z->_M_storage)._M_storage[0x2b] = '\0';
        (__z->_M_storage)._M_storage[0x2c] = '\0';
        (__z->_M_storage)._M_storage[0x2d] = '\0';
        (__z->_M_storage)._M_storage[0x2e] = '\0';
        (__z->_M_storage)._M_storage[0x2f] = '\0';
        (__z->_M_storage)._M_storage[0x30] = '\0';
        (__z->_M_storage)._M_storage[0x31] = '\0';
        (__z->_M_storage)._M_storage[0x32] = '\0';
        (__z->_M_storage)._M_storage[0x33] = '\0';
        (__z->_M_storage)._M_storage[0x34] = '\0';
        (__z->_M_storage)._M_storage[0x35] = '\0';
        (__z->_M_storage)._M_storage[0x36] = '\0';
        (__z->_M_storage)._M_storage[0x37] = '\0';
        (__z->_M_storage)._M_storage[0x38] = '\0';
        (__z->_M_storage)._M_storage[0x39] = '\0';
        (__z->_M_storage)._M_storage[0x3a] = '\0';
        (__z->_M_storage)._M_storage[0x3b] = '\0';
        (__z->_M_storage)._M_storage[0x3c] = '\0';
        (__z->_M_storage)._M_storage[0x3d] = '\0';
        (__z->_M_storage)._M_storage[0x3e] = '\0';
        (__z->_M_storage)._M_storage[0x3f] = '\0';
        (__z->_M_storage)._M_storage[0x40] = '\0';
        (__z->_M_storage)._M_storage[0x41] = '\0';
        (__z->_M_storage)._M_storage[0x42] = '\0';
        (__z->_M_storage)._M_storage[0x43] = '\0';
        (__z->_M_storage)._M_storage[0x44] = '\0';
        (__z->_M_storage)._M_storage[0x45] = '\0';
        (__z->_M_storage)._M_storage[0x46] = '\0';
        (__z->_M_storage)._M_storage[0x47] = '\0';
        (__z->_M_storage)._M_storage[0x58] = '\0';
        (__z->_M_storage)._M_storage[0x59] = '\0';
        (__z->_M_storage)._M_storage[0x5a] = '\0';
        (__z->_M_storage)._M_storage[0x5b] = '\0';
        (__z->_M_storage)._M_storage[0x5c] = '\0';
        (__z->_M_storage)._M_storage[0x5d] = '\0';
        (__z->_M_storage)._M_storage[0x5e] = '\0';
        (__z->_M_storage)._M_storage[0x5f] = '\0';
        (__z->_M_storage)._M_storage[0x50] = '\x01';
        (__z->_M_storage)._M_storage[0x51] = '\0';
        (__z->_M_storage)._M_storage[0x52] = '\0';
        (__z->_M_storage)._M_storage[0x53] = '\0';
        (__z->_M_storage)._M_storage[0x54] = '\0';
        (__z->_M_storage)._M_storage[0x55] = '\0';
        (__z->_M_storage)._M_storage[0x56] = '\0';
        (__z->_M_storage)._M_storage[0x57] = '\0';
        (__z->_M_storage)._M_storage[0x58] = '\x01';
        pVar5 = std::
                _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                ::_M_get_insert_hint_unique_pos(this_00,__position,(key_type *)curr);
        __x._M_node = pVar5.first;
        if (pVar5.second == (_Base_ptr)0x0) {
          std::
          _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
          ::_M_drop_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                          *)__z,(_Link_type_conflict1)__position._M_node);
        }
        else {
          std::
          _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
          ::_M_insert_node(this_00,__x._M_node,pVar5.second,__z);
          __x._M_node = (_Base_ptr)__z;
        }
      }
      local_38 = curr;
      if (*(long *)((long)this + 0x150) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((long)this + 0x158))
                ((long)this + 0x140,&local_38,
                 (((_Link_type_conflict1)__x._M_node)->_M_storage)._M_storage + 8);
      return;
    }
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<Info, wasm::Mutable>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = Info, Mut = wasm::Mutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }